

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall cs::internal_error::~internal_error(internal_error *this)

{
  internal_error *in_RDI;
  
  ~internal_error(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

~internal_error() override = default;